

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSTM.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeLSTM(ConvertLayerParameters layerParameters)

{
  RepeatedPtrField<CoreML::Specification::ActivationParams> *this;
  RepeatedField<float> *pRVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer plVar3;
  pointer plVar4;
  string *psVar5;
  uint64 uVar6;
  bool bVar7;
  char cVar8;
  unsigned_long __val;
  int iVar9;
  Type *pTVar10;
  Type *pTVar11;
  Type *pTVar12;
  LogMessage *pLVar13;
  long *plVar14;
  ulong *puVar15;
  mapped_type *pmVar16;
  uint64 *puVar17;
  LayerUnion this_00;
  WeightParams *pWVar18;
  Type *pTVar19;
  ActivationSigmoid *this_01;
  ActivationTanh *pAVar20;
  LSTMWeightParams *pLVar21;
  float *pfVar22;
  uint uVar23;
  size_type *psVar24;
  long *plVar25;
  unsigned_long uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined8 *puVar29;
  LayerUnion LVar30;
  uint uVar31;
  undefined8 uVar32;
  int iVar33;
  RecurrentParameter *pRVar34;
  uint __uval;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  string __str_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
  *in_stack_00000038;
  uint *in_stack_00000048;
  long __tmp;
  string __str_4;
  string cnamein;
  string __str_3;
  string hnameout;
  string cnameout;
  string hnamein;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_210;
  undefined1 local_1f0 [56];
  LayerUnion local_1b8;
  WeightParams *local_1b0;
  ulong local_1a8;
  string local_1a0;
  Type *local_180;
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  value_type local_138;
  long *local_118 [2];
  long local_108 [2];
  value_type local_f8;
  string local_d8;
  value_type local_b8;
  value_type local_98;
  uint64 local_78;
  unsigned_long local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  uVar37 = *in_stack_00000048;
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(__str_2._M_dataplus._M_p + 0x70),uVar37);
  iVar9 = getLayerIndex(pTVar10,in_stack_00000030);
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(__str_2._M_string_length + 0x70),iVar9);
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)__str_2.field_2._M_allocated_capacity,(Type *)0x0);
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180 = pTVar10;
  if ((pTVar10->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_48,
              (value_type *)((local_180->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  local_1b0 = (WeightParams *)in_stack_00000028;
  uVar35 = -uVar37;
  if (0 < (int)uVar37) {
    uVar35 = uVar37;
  }
  uVar36 = 1;
  if (9 < uVar35) {
    uVar27 = (ulong)uVar35;
    uVar31 = 4;
    do {
      uVar36 = uVar31;
      uVar23 = (uint)uVar27;
      if (uVar23 < 100) {
        uVar36 = uVar36 - 2;
        goto LAB_003dadd2;
      }
      if (uVar23 < 1000) {
        uVar36 = uVar36 - 1;
        goto LAB_003dadd2;
      }
      if (uVar23 < 10000) goto LAB_003dadd2;
      uVar27 = uVar27 / 10000;
      uVar31 = uVar36 + 4;
    } while (99999 < uVar23);
    uVar36 = uVar36 + 1;
  }
LAB_003dadd2:
  uVar31 = uVar37 >> 0x1f;
  cVar8 = (char)((int)uVar37 >> 0x1f);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_1b8 = (LayerUnion)pTVar12;
  std::__cxx11::string::_M_construct((ulong)&local_138,(char)uVar36 - cVar8);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_138._M_dataplus._M_p + uVar31,uVar36,uVar35)
  ;
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x5e52b4);
  local_1f0._0_8_ = local_1f0 + 0x10;
  psVar24 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar24) {
    local_1f0._16_8_ = *psVar24;
    local_1f0._24_8_ = plVar14[3];
  }
  else {
    local_1f0._16_8_ = *psVar24;
    local_1f0._0_8_ = (size_type *)*plVar14;
  }
  local_1f0._8_8_ = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_1f0);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  psVar24 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_98.field_2._M_allocated_capacity = *psVar24;
    local_98.field_2._8_8_ = plVar14[3];
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar24;
    local_98._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_98._M_string_length = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_48,&local_98);
  uVar37 = 1;
  if (9 < uVar35) {
    uVar27 = (ulong)uVar35;
    uVar36 = 4;
    do {
      uVar37 = uVar36;
      uVar23 = (uint)uVar27;
      if (uVar23 < 100) {
        uVar37 = uVar37 - 2;
        goto LAB_003daf84;
      }
      if (uVar23 < 1000) {
        uVar37 = uVar37 - 1;
        goto LAB_003daf84;
      }
      if (uVar23 < 10000) goto LAB_003daf84;
      uVar27 = uVar27 / 10000;
      uVar36 = uVar37 + 4;
    } while (99999 < uVar23);
    uVar37 = uVar37 + 1;
  }
LAB_003daf84:
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_f8,(char)uVar37 - cVar8);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_f8._M_dataplus._M_p + uVar31,uVar37,uVar35);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x5e52b4);
  local_1f0._0_8_ = local_1f0 + 0x10;
  psVar24 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar24) {
    local_1f0._16_8_ = *psVar24;
    local_1f0._24_8_ = plVar14[3];
  }
  else {
    local_1f0._16_8_ = *psVar24;
    local_1f0._0_8_ = (size_type *)*plVar14;
  }
  local_1f0._8_8_ = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_1f0);
  psVar24 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_138.field_2._M_allocated_capacity = *psVar24;
    local_138.field_2._8_8_ = plVar14[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar24;
    local_138._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_138._M_string_length = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_48,&local_138);
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((local_180->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_f8,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_68,
              (value_type *)((local_180->top_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  uVar37 = 1;
  if (9 < uVar35) {
    uVar27 = (ulong)uVar35;
    uVar36 = 4;
    do {
      uVar37 = uVar36;
      uVar23 = (uint)uVar27;
      if (uVar23 < 100) {
        uVar37 = uVar37 - 2;
        goto LAB_003db1b9;
      }
      if (uVar23 < 1000) {
        uVar37 = uVar37 - 1;
        goto LAB_003db1b9;
      }
      if (uVar23 < 10000) goto LAB_003db1b9;
      uVar27 = uVar27 / 10000;
      uVar36 = uVar37 + 4;
    } while (99999 < uVar23);
    uVar37 = uVar37 + 1;
  }
LAB_003db1b9:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar37 - cVar8);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_b8._M_dataplus._M_p + uVar31,uVar37,uVar35);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x5e52b4);
  local_1f0._0_8_ = local_1f0 + 0x10;
  psVar24 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar24) {
    local_1f0._16_8_ = *psVar24;
    local_1f0._24_8_ = plVar14[3];
  }
  else {
    local_1f0._16_8_ = *psVar24;
    local_1f0._0_8_ = (size_type *)*plVar14;
  }
  local_1f0._8_8_ = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_1f0);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  psVar24 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_f8.field_2._M_allocated_capacity = *psVar24;
    local_f8.field_2._8_8_ = plVar14[3];
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar24;
    local_f8._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_f8._M_string_length = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_68,&local_f8);
  uVar37 = 1;
  if (9 < uVar35) {
    uVar27 = (ulong)uVar35;
    uVar36 = 4;
    do {
      uVar37 = uVar36;
      uVar23 = (uint)uVar27;
      if (uVar23 < 100) {
        uVar37 = uVar37 - 2;
        goto LAB_003db365;
      }
      if (uVar23 < 1000) {
        uVar37 = uVar37 - 1;
        goto LAB_003db365;
      }
      if (uVar23 < 10000) goto LAB_003db365;
      uVar27 = uVar27 / 10000;
      uVar36 = uVar37 + 4;
    } while (99999 < uVar23);
    uVar37 = uVar37 + 1;
  }
LAB_003db365:
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_210,(char)uVar37 - cVar8);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_210._M_dataplus._M_p + uVar31,uVar37,uVar35)
  ;
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,0x5e52b4);
  local_1f0._0_8_ = local_1f0 + 0x10;
  psVar24 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar24) {
    local_1f0._16_8_ = *psVar24;
    local_1f0._24_8_ = plVar14[3];
  }
  else {
    local_1f0._16_8_ = *psVar24;
    local_1f0._0_8_ = (size_type *)*plVar14;
  }
  local_1f0._8_8_ = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_1f0);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar24 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_b8.field_2._M_allocated_capacity = *psVar24;
    local_b8.field_2._8_8_ = plVar14[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar24;
    local_b8._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_b8._M_string_length = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_68,&local_b8);
  pTVar10 = local_180;
  convertCaffeMetadata
            ((local_180->name_).ptr_,&local_48,&local_68,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
             __str_2.field_2._M_allocated_capacity,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1b0);
  pRVar34 = pTVar10->recurrent_param_;
  if (pRVar34 == (RecurrentParameter *)0x0) {
    pRVar34 = (RecurrentParameter *)&caffe::_RecurrentParameter_default_instance_;
  }
  uVar37 = pRVar34->num_output_;
  puVar15 = (ulong *)operator_new(8);
  *puVar15 = (ulong)uVar37;
  local_1b0 = (WeightParams *)(ulong)uVar37;
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
            ::operator[](in_stack_00000038,&local_98);
  plVar3 = (pmVar16->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  plVar4 = (pmVar16->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (pmVar16->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)puVar15;
  (pmVar16->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(puVar15 + 1);
  (pmVar16->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(puVar15 + 1);
  if (plVar3 != (pointer)0x0) {
    operator_delete(plVar3,(long)plVar4 - (long)plVar3);
  }
  puVar17 = (uint64 *)operator_new(8);
  *puVar17 = (uint64)local_1b0;
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
            ::operator[](in_stack_00000038,&local_138);
  plVar3 = (pmVar16->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  plVar4 = (pmVar16->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (pmVar16->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)puVar17;
  (pmVar16->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(puVar17 + 1);
  (pmVar16->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(puVar17 + 1);
  if (plVar3 != (pointer)0x0) {
    operator_delete(plVar3,(long)plVar4 - (long)plVar3);
  }
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"Weights not found in the caffemodel file","");
    psVar5 = (local_180->name_).ptr_;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Recurrent","");
    errorInCaffeProto((string *)local_1f0,psVar5,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
  }
  if (local_1b0 == (WeightParams *)0x0) {
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"\'num_output\' cannot be non-positive","");
    psVar5 = (local_180->name_).ptr_;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Recurrent","");
    errorInCaffeProto((string *)local_1f0,psVar5,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
  }
  LVar30 = local_1b8;
  if (pRVar34->expose_hidden_ == true) {
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"expose_hidden","");
    psVar5 = (local_180->name_).ptr_;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Recurrent","");
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"True","");
    unsupportedCaffeParrameterWithOption((string *)local_1f0,psVar5,&local_210,&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
  }
  if (*(uint32 *)((long)LVar30 + 0x8c) == 0x1a4) {
    this_00 = *(LayerUnion *)((long)LVar30 + 0x80);
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer((NeuralNetworkLayer *)LVar30);
    *(uint32 *)((long)LVar30 + 0x8c) = 0x1a4;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x50);
    CoreML::Specification::UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams
              (this_00.unidirectionallstm_);
    ((LayerUnion *)((long)LVar30 + 0x80))->unidirectionallstm_ =
         (UniDirectionalLSTMLayerParams *)this_00;
  }
  local_1b8 = this_00;
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    this_00 = local_1b8;
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  puVar29 = *(undefined8 **)
             ((long)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
  if (puVar29 == (undefined8 *)0x0) {
    puVar29 = &caffe::_BlobShape_default_instance_;
  }
  if (*(int *)(puVar29 + 3) < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    this_00 = local_1b8;
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  uVar6 = *(uint64 *)(puVar29[4] + 0x10);
  (this_00.scale_)->scale_ = local_1b0;
  if ((long)uVar6 < 0) {
    __assert_fail("input_size >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/LSTM.cpp"
                  ,0x4d,
                  "void CoreMLConverter::convertCaffeLSTM(CoreMLConverter::ConvertLayerParameters)")
    ;
  }
  (this_00.simplerecurrent_)->outputvectorsize_ = uVar6;
  pWVar18 = (this_00.batchnorm_)->variance_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x20);
    CoreML::Specification::LSTMParams::LSTMParams((LSTMParams *)pWVar18);
    (local_1b8.unidirectionallstm_)->params_ = (LSTMParams *)pWVar18;
    this_00 = local_1b8;
  }
  *(undefined2 *)&(pWVar18->floatvalue_).total_size_ = 0x100;
  *(bool *)((long)&(pWVar18->floatvalue_).total_size_ + 2) = false;
  this = (RepeatedPtrField<CoreML::Specification::ActivationParams> *)
         &(this_00.convolution_)->kernelsize_;
  pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this,(Type *)0x0);
  if (pTVar19->_oneof_case_[0] != 0x28) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pTVar19);
    pTVar19->_oneof_case_[0] = 0x28;
    this_01 = (ActivationSigmoid *)operator_new(0x18);
    CoreML::Specification::ActivationSigmoid::ActivationSigmoid(this_01);
    (pTVar19->NonlinearityType_).sigmoid_ = this_01;
  }
  pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this,(Type *)0x0);
  if (pTVar19->_oneof_case_[0] != 0x1e) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pTVar19);
    pTVar19->_oneof_case_[0] = 0x1e;
    pAVar20 = (ActivationTanh *)operator_new(0x18);
    CoreML::Specification::ActivationTanh::ActivationTanh(pAVar20);
    (pTVar19->NonlinearityType_).tanh_ = pAVar20;
  }
  pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this,(Type *)0x0);
  if (pTVar19->_oneof_case_[0] != 0x1e) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pTVar19);
    pTVar19->_oneof_case_[0] = 0x1e;
    pAVar20 = (ActivationTanh *)operator_new(0x18);
    CoreML::Specification::ActivationTanh::ActivationTanh(pAVar20);
    (pTVar19->NonlinearityType_).tanh_ = pAVar20;
  }
  LVar30 = local_1b8;
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    LVar30 = local_1b8;
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  uVar37 = *(uint *)((long)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18);
  local_1a8 = (ulong)uVar37;
  local_70 = (long)local_1b0 * 4;
  uVar27 = uVar6 * local_70;
  if (uVar27 - (long)(int)uVar37 != 0) {
    uVar37 = 1;
    if (9 < uVar27) {
      uVar28 = uVar27;
      uVar35 = 4;
      do {
        uVar37 = uVar35;
        if (uVar28 < 100) {
          uVar37 = uVar37 - 2;
          goto LAB_003dbad2;
        }
        if (uVar28 < 1000) {
          uVar37 = uVar37 - 1;
          goto LAB_003dbad2;
        }
        if (uVar28 < 10000) goto LAB_003dbad2;
        bVar7 = 99999 < uVar28;
        uVar28 = uVar28 / 10000;
        uVar35 = uVar37 + 4;
      } while (bVar7);
      uVar37 = uVar37 + 1;
    }
LAB_003dbad2:
    local_118[0] = local_108;
    std::__cxx11::string::_M_construct((ulong)local_118,(char)uVar37);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_118[0],uVar37,uVar27);
    plVar14 = (long *)std::__cxx11::string::replace((ulong)local_118,0,(char *)0x0,0x5e4537);
    uVar27 = local_1a8;
    local_158 = &local_148;
    plVar25 = plVar14 + 2;
    if ((long *)*plVar14 == plVar25) {
      local_148 = *plVar25;
      lStack_140 = plVar14[3];
    }
    else {
      local_148 = *plVar25;
      local_158 = (long *)*plVar14;
    }
    local_150 = plVar14[1];
    *plVar14 = (long)plVar25;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_158);
    paVar2 = &local_1a0.field_2;
    puVar15 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_1a0.field_2._M_allocated_capacity = *puVar15;
      local_1a0.field_2._8_8_ = plVar14[3];
      local_1a0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *puVar15;
      local_1a0._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_1a0._M_string_length = plVar14[1];
    *plVar14 = (long)puVar15;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    uVar35 = (uint)uVar27;
    uVar37 = -uVar35;
    if (0 < (int)uVar35) {
      uVar37 = uVar35;
    }
    uVar35 = 1;
    if (9 < uVar37) {
      uVar28 = (ulong)uVar37;
      uVar36 = 4;
      do {
        uVar35 = uVar36;
        uVar31 = (uint)uVar28;
        if (uVar31 < 100) {
          uVar35 = uVar35 - 2;
          goto LAB_003dbc37;
        }
        if (uVar31 < 1000) {
          uVar35 = uVar35 - 1;
          goto LAB_003dbc37;
        }
        if (uVar31 < 10000) goto LAB_003dbc37;
        uVar28 = uVar28 / 10000;
        uVar36 = uVar35 + 4;
      } while (99999 < uVar31);
      uVar35 = uVar35 + 1;
    }
LAB_003dbc37:
    uVar27 = uVar27 >> 0x1f & 1;
    local_178 = local_168;
    std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar35 + (char)uVar27);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(uVar27 + (long)local_178),uVar35,uVar37);
    uVar32 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar2) {
      uVar32 = local_1a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar32 < local_170 + local_1a0._M_string_length) {
      uVar27 = 0xf;
      if (local_178 != local_168) {
        uVar27 = local_168[0];
      }
      if (uVar27 < local_170 + local_1a0._M_string_length) goto LAB_003dbcc5;
      puVar29 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_178,0,(char *)0x0,(ulong)local_1a0._M_dataplus._M_p);
    }
    else {
LAB_003dbcc5:
      puVar29 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_178);
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    psVar24 = puVar29 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar29 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar24) {
      local_210.field_2._M_allocated_capacity = *psVar24;
      local_210.field_2._8_8_ = puVar29[3];
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar24;
      local_210._M_dataplus._M_p = (pointer)*puVar29;
    }
    local_210._M_string_length = puVar29[1];
    *puVar29 = psVar24;
    puVar29[1] = 0;
    *(undefined1 *)psVar24 = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_210);
    local_1f0._0_8_ = local_1f0 + 0x10;
    psVar24 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar24) {
      local_1f0._16_8_ = *psVar24;
      local_1f0._24_8_ = plVar14[3];
    }
    else {
      local_1f0._16_8_ = *psVar24;
      local_1f0._0_8_ = (size_type *)*plVar14;
    }
    local_1f0._8_8_ = plVar14[1];
    *plVar14 = (long)psVar24;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    psVar5 = (local_180->name_).ptr_;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Recurrent","");
    errorInCaffeProto((string *)local_1f0,psVar5,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    LVar30 = local_1b8;
    uVar37 = (uint)local_1a8;
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_178 != local_168) {
      operator_delete(local_178,local_168[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_118[0] != local_108) {
      operator_delete(local_118[0],local_108[0] + 1);
    }
  }
  pLVar21 = (LVar30.unidirectionallstm_)->weightparams_;
  if (pLVar21 == (LSTMWeightParams *)0x0) {
    pLVar21 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar21);
    (LVar30.unidirectionallstm_)->weightparams_ = pLVar21;
  }
  pWVar18 = pLVar21->inputgateweightmatrix_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    pLVar21->inputgateweightmatrix_ = pWVar18;
  }
  uVar35 = uVar37 + 3;
  if (-1 < (int)uVar37) {
    uVar35 = uVar37;
  }
  local_78 = uVar6;
  if ((int)uVar37 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pRVar1 = &pWVar18->floatvalue_;
  iVar9 = (int)uVar35 >> 2;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar38,0,(long)iVar9 * 4 + (long)iVar38 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar9;
  if (3 < (int)uVar37) {
    iVar38 = 0;
    do {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                           0x18),iVar38);
      local_210._M_dataplus._M_p._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar38,(float *)&local_210);
      iVar38 = iVar38 + 1;
    } while (iVar9 != iVar38);
  }
  uVar27 = local_1a8;
  LVar30 = local_1b8;
  pLVar21 = (local_1b8.unidirectionallstm_)->weightparams_;
  if (pLVar21 == (LSTMWeightParams *)0x0) {
    pLVar21 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar21);
    (LVar30.unidirectionallstm_)->weightparams_ = pLVar21;
  }
  pWVar18 = pLVar21->forgetgateweightmatrix_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    pLVar21->forgetgateweightmatrix_ = pWVar18;
  }
  if ((int)uVar27 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pRVar1 = &pWVar18->floatvalue_;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar38,0,(long)iVar9 * 4 + (long)iVar38 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar9;
  if (3 < (int)uVar27) {
    iVar38 = (int)local_78 * (uint)local_1b0;
    iVar33 = 0;
    do {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                           0x18),iVar38 + iVar33);
      local_210._M_dataplus._M_p._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar33,(float *)&local_210);
      iVar33 = iVar33 + 1;
    } while (iVar9 != iVar33);
  }
  uVar27 = local_1a8;
  LVar30 = local_1b8;
  pLVar21 = (local_1b8.unidirectionallstm_)->weightparams_;
  if (pLVar21 == (LSTMWeightParams *)0x0) {
    pLVar21 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar21);
    (LVar30.unidirectionallstm_)->weightparams_ = pLVar21;
  }
  pWVar18 = pLVar21->outputgateweightmatrix_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    pLVar21->outputgateweightmatrix_ = pWVar18;
  }
  if ((int)uVar27 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pRVar1 = &pWVar18->floatvalue_;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar38,0,(long)iVar9 * 4 + (long)iVar38 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar9;
  if (3 < (int)uVar27) {
    iVar38 = (int)local_78 * (uint)local_1b0;
    iVar33 = 0;
    do {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                           0x18),iVar38 * 2 + iVar33);
      local_210._M_dataplus._M_p._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar33,(float *)&local_210);
      iVar33 = iVar33 + 1;
    } while (iVar9 != iVar33);
  }
  uVar27 = local_1a8;
  LVar30 = local_1b8;
  pLVar21 = (local_1b8.unidirectionallstm_)->weightparams_;
  if (pLVar21 == (LSTMWeightParams *)0x0) {
    pLVar21 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar21);
    (LVar30.unidirectionallstm_)->weightparams_ = pLVar21;
  }
  pWVar18 = pLVar21->blockinputweightmatrix_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    pLVar21->blockinputweightmatrix_ = pWVar18;
  }
  if ((int)uVar27 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pRVar1 = &pWVar18->floatvalue_;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar38,0,(long)iVar9 * 4 + (long)iVar38 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar9;
  if (3 < (int)uVar27) {
    iVar38 = (int)local_78 * (uint)local_1b0;
    iVar33 = 0;
    do {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                           0x18),iVar38 * 3 + iVar33);
      local_210._M_dataplus._M_p._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar33,(float *)&local_210);
      iVar33 = iVar33 + 1;
    } while (iVar9 != iVar33);
  }
  LVar30 = local_1b8;
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    LVar30 = local_1b8;
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  __val = local_70;
  uVar37 = *(uint *)(*(long *)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18);
  local_1a8 = (ulong)uVar37;
  if (local_70 != (long)(int)uVar37) {
    uVar35 = 1;
    if (2 < (uint)local_1b0) {
      uVar26 = local_70;
      uVar36 = 4;
      do {
        uVar35 = uVar36;
        if (uVar26 < 100) {
          uVar35 = uVar35 - 2;
          goto LAB_003dc593;
        }
        if (uVar26 < 1000) {
          uVar35 = uVar35 - 1;
          goto LAB_003dc593;
        }
        if (uVar26 < 10000) goto LAB_003dc593;
        bVar7 = 99999 < uVar26;
        uVar26 = uVar26 / 10000;
        uVar36 = uVar35 + 4;
      } while (bVar7);
      uVar35 = uVar35 + 1;
    }
LAB_003dc593:
    local_118[0] = local_108;
    std::__cxx11::string::_M_construct((ulong)local_118,(char)uVar35);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_118[0],uVar35,__val);
    plVar14 = (long *)std::__cxx11::string::replace((ulong)local_118,0,(char *)0x0,0x5e4537);
    local_158 = &local_148;
    plVar25 = plVar14 + 2;
    if ((long *)*plVar14 == plVar25) {
      local_148 = *plVar25;
      lStack_140 = plVar14[3];
    }
    else {
      local_148 = *plVar25;
      local_158 = (long *)*plVar14;
    }
    local_150 = plVar14[1];
    *plVar14 = (long)plVar25;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_158);
    paVar2 = &local_1a0.field_2;
    puVar15 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_1a0.field_2._M_allocated_capacity = *puVar15;
      local_1a0.field_2._8_8_ = plVar14[3];
      local_1a0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *puVar15;
      local_1a0._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_1a0._M_string_length = plVar14[1];
    *plVar14 = (long)puVar15;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    uVar35 = -uVar37;
    if (0 < (int)uVar37) {
      uVar35 = uVar37;
    }
    uVar36 = 1;
    if (9 < uVar35) {
      uVar27 = (ulong)uVar35;
      uVar31 = 4;
      do {
        uVar36 = uVar31;
        uVar23 = (uint)uVar27;
        if (uVar23 < 100) {
          uVar36 = uVar36 - 2;
          goto LAB_003dc6f4;
        }
        if (uVar23 < 1000) {
          uVar36 = uVar36 - 1;
          goto LAB_003dc6f4;
        }
        if (uVar23 < 10000) goto LAB_003dc6f4;
        uVar27 = uVar27 / 10000;
        uVar31 = uVar36 + 4;
      } while (99999 < uVar23);
      uVar36 = uVar36 + 1;
    }
LAB_003dc6f4:
    local_178 = local_168;
    std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar36 - (char)((int)uVar37 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar37 >> 0x1f) + (long)local_178),uVar36,uVar35);
    uVar32 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar2) {
      uVar32 = local_1a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar32 < local_170 + local_1a0._M_string_length) {
      uVar27 = 0xf;
      if (local_178 != local_168) {
        uVar27 = local_168[0];
      }
      if (uVar27 < local_170 + local_1a0._M_string_length) goto LAB_003dc781;
      puVar29 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_178,0,(char *)0x0,(ulong)local_1a0._M_dataplus._M_p);
    }
    else {
LAB_003dc781:
      puVar29 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_178);
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    psVar24 = puVar29 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar29 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar24) {
      local_210.field_2._M_allocated_capacity = *psVar24;
      local_210.field_2._8_8_ = puVar29[3];
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar24;
      local_210._M_dataplus._M_p = (pointer)*puVar29;
    }
    local_210._M_string_length = puVar29[1];
    *puVar29 = psVar24;
    puVar29[1] = 0;
    *(undefined1 *)psVar24 = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_210);
    local_1f0._0_8_ = local_1f0 + 0x10;
    psVar24 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar24) {
      local_1f0._16_8_ = *psVar24;
      local_1f0._24_8_ = plVar14[3];
    }
    else {
      local_1f0._16_8_ = *psVar24;
      local_1f0._0_8_ = (size_type *)*plVar14;
    }
    local_1f0._8_8_ = plVar14[1];
    *plVar14 = (long)psVar24;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    psVar5 = (local_180->name_).ptr_;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Recurrent","");
    errorInCaffeProto((string *)local_1f0,psVar5,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    LVar30 = local_1b8;
    uVar37 = (uint)local_1a8;
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_178 != local_168) {
      operator_delete(local_178,local_168[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_118[0] != local_108) {
      operator_delete(local_118[0],local_108[0] + 1);
    }
  }
  pLVar21 = (LVar30.unidirectionallstm_)->weightparams_;
  if (pLVar21 == (LSTMWeightParams *)0x0) {
    pLVar21 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar21);
    (LVar30.unidirectionallstm_)->weightparams_ = pLVar21;
  }
  pWVar18 = pLVar21->inputgatebiasvector_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    pLVar21->inputgatebiasvector_ = pWVar18;
  }
  uVar35 = uVar37 + 3;
  if (-1 < (int)uVar37) {
    uVar35 = uVar37;
  }
  if ((int)uVar37 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pRVar1 = &pWVar18->floatvalue_;
  iVar9 = (int)uVar35 >> 2;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar38,0,(long)iVar9 * 4 + (long)iVar38 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar9;
  if (3 < (int)uVar37) {
    iVar38 = 0;
    do {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           (*(long *)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18)
                           ,iVar38);
      local_210._M_dataplus._M_p._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar38,(float *)&local_210);
      iVar38 = iVar38 + 1;
    } while (iVar9 != iVar38);
  }
  uVar27 = local_1a8;
  LVar30 = local_1b8;
  pLVar21 = (local_1b8.unidirectionallstm_)->weightparams_;
  if (pLVar21 == (LSTMWeightParams *)0x0) {
    pLVar21 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar21);
    (LVar30.unidirectionallstm_)->weightparams_ = pLVar21;
  }
  pWVar18 = pLVar21->forgetgatebiasvector_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    pLVar21->forgetgatebiasvector_ = pWVar18;
  }
  if ((int)uVar27 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pRVar1 = &pWVar18->floatvalue_;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar38,0,(long)iVar9 * 4 + (long)iVar38 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar9;
  if (3 < (int)uVar27) {
    iVar38 = 0;
    do {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           (*(long *)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18)
                           ,(int)local_1b0 + iVar38);
      local_210._M_dataplus._M_p._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar38,(float *)&local_210);
      iVar38 = iVar38 + 1;
    } while (iVar9 != iVar38);
  }
  uVar27 = local_1a8;
  LVar30 = local_1b8;
  pLVar21 = (local_1b8.unidirectionallstm_)->weightparams_;
  if (pLVar21 == (LSTMWeightParams *)0x0) {
    pLVar21 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar21);
    (LVar30.unidirectionallstm_)->weightparams_ = pLVar21;
  }
  pWVar18 = pLVar21->outputgatebiasvector_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    pLVar21->outputgatebiasvector_ = pWVar18;
  }
  if ((int)uVar27 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pRVar1 = &pWVar18->floatvalue_;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar38,0,(long)iVar9 * 4 + (long)iVar38 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar9;
  if (3 < (int)uVar27) {
    iVar38 = (int)local_1b0;
    iVar33 = 0;
    do {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           (*(long *)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18)
                           ,iVar38 * 2 + iVar33);
      local_210._M_dataplus._M_p._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar33,(float *)&local_210);
      iVar33 = iVar33 + 1;
    } while (iVar9 != iVar33);
  }
  uVar27 = local_1a8;
  LVar30 = local_1b8;
  pLVar21 = (local_1b8.unidirectionallstm_)->weightparams_;
  if (pLVar21 == (LSTMWeightParams *)0x0) {
    pLVar21 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar21);
    (LVar30.unidirectionallstm_)->weightparams_ = pLVar21;
  }
  pWVar18 = pLVar21->blockinputbiasvector_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    pLVar21->blockinputbiasvector_ = pWVar18;
  }
  if ((int)uVar27 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pRVar1 = &pWVar18->floatvalue_;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar38,0,(long)iVar9 * 4 + (long)iVar38 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar9;
  if (3 < (int)uVar27) {
    iVar38 = (int)local_1b0;
    iVar33 = 0;
    do {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           (*(long *)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18)
                           ,iVar38 * 3 + iVar33);
      local_210._M_dataplus._M_p._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar33,(float *)&local_210);
      iVar33 = iVar33 + 1;
    } while (iVar9 != iVar33);
  }
  LVar30 = local_1b8;
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    LVar30 = local_1b8;
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  uVar37 = *(uint *)((long)(pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_[1].elements[0] + 0x18);
  local_1a8 = (ulong)uVar37;
  uVar27 = local_70 * (long)local_1b0;
  if (uVar27 - (long)(int)uVar37 == 0) goto LAB_003dd3f5;
  uVar35 = 1;
  if (9 < uVar27) {
    uVar28 = uVar27;
    uVar36 = 4;
    do {
      uVar35 = uVar36;
      if (uVar28 < 100) {
        uVar35 = uVar35 - 2;
        goto LAB_003dd02e;
      }
      if (uVar28 < 1000) {
        uVar35 = uVar35 - 1;
        goto LAB_003dd02e;
      }
      if (uVar28 < 10000) goto LAB_003dd02e;
      bVar7 = 99999 < uVar28;
      uVar28 = uVar28 / 10000;
      uVar36 = uVar35 + 4;
    } while (bVar7);
    uVar35 = uVar35 + 1;
  }
LAB_003dd02e:
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct((ulong)local_118,(char)uVar35);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_118[0],uVar35,uVar27);
  plVar14 = (long *)std::__cxx11::string::replace((ulong)local_118,0,(char *)0x0,0x5e4537);
  local_158 = &local_148;
  plVar25 = plVar14 + 2;
  if ((long *)*plVar14 == plVar25) {
    local_148 = *plVar25;
    lStack_140 = plVar14[3];
  }
  else {
    local_148 = *plVar25;
    local_158 = (long *)*plVar14;
  }
  local_150 = plVar14[1];
  *plVar14 = (long)plVar25;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_158);
  paVar2 = &local_1a0.field_2;
  puVar15 = (ulong *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_1a0.field_2._M_allocated_capacity = *puVar15;
    local_1a0.field_2._8_8_ = plVar14[3];
    local_1a0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *puVar15;
    local_1a0._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_1a0._M_string_length = plVar14[1];
  *plVar14 = (long)puVar15;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  uVar35 = -uVar37;
  if (0 < (int)uVar37) {
    uVar35 = uVar37;
  }
  uVar36 = 1;
  if (9 < uVar35) {
    uVar27 = (ulong)uVar35;
    uVar31 = 4;
    do {
      uVar36 = uVar31;
      uVar23 = (uint)uVar27;
      if (uVar23 < 100) {
        uVar36 = uVar36 - 2;
        goto LAB_003dd189;
      }
      if (uVar23 < 1000) {
        uVar36 = uVar36 - 1;
        goto LAB_003dd189;
      }
      if (uVar23 < 10000) goto LAB_003dd189;
      uVar27 = uVar27 / 10000;
      uVar31 = uVar36 + 4;
    } while (99999 < uVar23);
    uVar36 = uVar36 + 1;
  }
LAB_003dd189:
  local_178 = local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,(char)uVar36 - (char)((int)uVar37 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar37 >> 0x1f) + (long)local_178),uVar36,uVar35);
  uVar32 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    uVar32 = local_1a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar32 < local_170 + local_1a0._M_string_length) {
    uVar27 = 0xf;
    if (local_178 != local_168) {
      uVar27 = local_168[0];
    }
    if (uVar27 < local_170 + local_1a0._M_string_length) goto LAB_003dd213;
    puVar29 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_178,0,(char *)0x0,(ulong)local_1a0._M_dataplus._M_p);
  }
  else {
LAB_003dd213:
    puVar29 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_178);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  psVar24 = puVar29 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar29 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_210.field_2._M_allocated_capacity = *psVar24;
    local_210.field_2._8_8_ = puVar29[3];
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar24;
    local_210._M_dataplus._M_p = (pointer)*puVar29;
  }
  local_210._M_string_length = puVar29[1];
  *puVar29 = psVar24;
  puVar29[1] = 0;
  *(undefined1 *)psVar24 = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_210);
  local_1f0._0_8_ = local_1f0 + 0x10;
  psVar24 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar24) {
    local_1f0._16_8_ = *psVar24;
    local_1f0._24_8_ = plVar14[3];
  }
  else {
    local_1f0._16_8_ = *psVar24;
    local_1f0._0_8_ = (size_type *)*plVar14;
  }
  local_1f0._8_8_ = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  psVar5 = (local_180->name_).ptr_;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Recurrent","");
  errorInCaffeProto((string *)local_1f0,psVar5,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  LVar30 = local_1b8;
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  uVar37 = (uint)local_1a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
LAB_003dd3f5:
  pLVar21 = (LVar30.unidirectionallstm_)->weightparams_;
  if (pLVar21 == (LSTMWeightParams *)0x0) {
    pLVar21 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar21);
    (LVar30.unidirectionallstm_)->weightparams_ = pLVar21;
  }
  pWVar18 = pLVar21->inputgaterecursionmatrix_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    pLVar21->inputgaterecursionmatrix_ = pWVar18;
  }
  uVar35 = uVar37 + 3;
  if (-1 < (int)uVar37) {
    uVar35 = uVar37;
  }
  if ((int)uVar37 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pRVar1 = &pWVar18->floatvalue_;
  iVar9 = (int)uVar35 >> 2;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar38,0,(long)iVar9 * 4 + (long)iVar38 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar9;
  if (3 < (int)uVar37) {
    iVar38 = 0;
    do {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 3) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)(pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_[1].elements[0] +
                           0x18),iVar38);
      local_210._M_dataplus._M_p._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar38,(float *)&local_210);
      iVar38 = iVar38 + 1;
    } while (iVar9 != iVar38);
  }
  uVar27 = local_1a8;
  LVar30 = local_1b8;
  pLVar21 = (local_1b8.unidirectionallstm_)->weightparams_;
  if (pLVar21 == (LSTMWeightParams *)0x0) {
    pLVar21 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar21);
    (LVar30.unidirectionallstm_)->weightparams_ = pLVar21;
  }
  pWVar18 = pLVar21->forgetgaterecursionmatrix_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    pLVar21->forgetgaterecursionmatrix_ = pWVar18;
  }
  if ((int)uVar27 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pRVar1 = &pWVar18->floatvalue_;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar38,0,(long)iVar9 * 4 + (long)iVar38 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar9;
  if (3 < (int)uVar27) {
    iVar38 = (int)local_1b0;
    iVar33 = 0;
    do {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 3) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)(pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_[1].elements[0] +
                           0x18),iVar38 * iVar38 + iVar33);
      local_210._M_dataplus._M_p._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar33,(float *)&local_210);
      iVar33 = iVar33 + 1;
    } while (iVar9 != iVar33);
  }
  uVar27 = local_1a8;
  LVar30 = local_1b8;
  pLVar21 = (local_1b8.unidirectionallstm_)->weightparams_;
  if (pLVar21 == (LSTMWeightParams *)0x0) {
    pLVar21 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar21);
    (LVar30.unidirectionallstm_)->weightparams_ = pLVar21;
  }
  pWVar18 = pLVar21->outputgaterecursionmatrix_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    pLVar21->outputgaterecursionmatrix_ = pWVar18;
  }
  if ((int)uVar27 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pRVar1 = &pWVar18->floatvalue_;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar38,0,(long)iVar9 * 4 + (long)iVar38 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar9;
  if (3 < (int)uVar27) {
    iVar38 = (int)local_1b0;
    iVar33 = 0;
    do {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 3) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)(pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_[1].elements[0] +
                           0x18),iVar38 * iVar38 * 2 + iVar33);
      local_210._M_dataplus._M_p._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar33,(float *)&local_210);
      iVar33 = iVar33 + 1;
    } while (iVar9 != iVar33);
  }
  uVar27 = local_1a8;
  LVar30 = local_1b8;
  pLVar21 = (local_1b8.unidirectionallstm_)->weightparams_;
  if (pLVar21 == (LSTMWeightParams *)0x0) {
    pLVar21 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar21);
    (LVar30.unidirectionallstm_)->weightparams_ = pLVar21;
  }
  pWVar18 = pLVar21->blockinputrecursionmatrix_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    pLVar21->blockinputrecursionmatrix_ = pWVar18;
  }
  if ((int)uVar27 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar13 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_1f0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar13);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
  }
  pRVar1 = &pWVar18->floatvalue_;
  if (pRVar1->current_size_ < iVar9) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar9);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar9) {
      memset(((pWVar18->floatvalue_).rep_)->elements + iVar38,0,(long)iVar9 * 4 + (long)iVar38 * -4)
      ;
    }
  }
  pRVar1->current_size_ = iVar9;
  if (3 < (int)uVar27) {
    iVar38 = (int)local_1b0;
    iVar33 = 0;
    do {
      if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 3) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar13 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_1f0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar13);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)(pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_[1].elements[0] +
                           0x18),iVar38 * iVar38 * 3 + iVar33);
      local_210._M_dataplus._M_p._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar33,(float *)&local_210);
      iVar33 = iVar33 + 1;
    } while (iVar9 != iVar33);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeLSTM(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;

    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    std::vector<std::string> bottom;
    // Caffe LSTM layers take an extra input, a binary indicator to show where one input sequence
    // ends and the next begins in order to reset the hidden state for this occurrence.
    // Since we don't support this, we need to ignore this input
    bottom.push_back(caffeLayer.bottom(0));
    // Now, we need to add the addtional hidden inputs and outputs
    std::string hnamein = "LSTM_" + std::to_string(layerId) + "_h_in";
    bottom.push_back(hnamein);
    std::string cnamein = "LSTM_" + std::to_string(layerId) + "_c_in";
    bottom.push_back(cnamein);
    
    // Same deal for top names
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    std::string hnameout = "LSTM_" + std::to_string(layerId) + "_h_out";
    top.push_back(hnameout);
    std::string cnameout = "LSTM_" + std::to_string(layerId) + "_c_out";
    top.push_back(cnameout);
    
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::RecurrentParameter& caffeLayerParams = caffeLayer.recurrent_param();
    uint32_t hidden_size = caffeLayerParams.num_output();
    layerParameters.mapBlobNameToDimensions[hnamein] = std::vector<int64_t>(1, hidden_size);
    layerParameters.mapBlobNameToDimensions[cnamein] = std::vector<int64_t>(1, hidden_size);
    
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerWeights.blobs_size()==0){
        CoreMLConverter::errorInCaffeProto("Weights not found in the caffemodel file", caffeLayer.name(), "Recurrent");
    }
    if (hidden_size<=0) {
        CoreMLConverter::errorInCaffeProto("'num_output' cannot be non-positive",caffeLayer.name(),"Recurrent");
    }
    if (caffeLayerParams.expose_hidden()) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("expose_hidden",caffeLayer.name(),"Recurrent","True");
    }
    //**************************************************************

    Specification::UniDirectionalLSTMLayerParams* specLayerParams = specLayer->mutable_unidirectionallstm();

    // Caffe is stored input, bias, Hidden
    int64_t input_size = caffeLayerWeights.blobs(0).shape().dim(1);

    specLayerParams->set_outputvectorsize(static_cast<uint64_t>(hidden_size));
    assert(input_size >= 0);
    specLayerParams->set_inputvectorsize(static_cast<uint64_t>(input_size));
    
    specLayerParams->mutable_params()->set_sequenceoutput(false);
    // Caffe doesn't support forget bias, so it won't come up
    specLayerParams->mutable_params()->set_forgetbias(false);
    specLayerParams->mutable_params()->set_hasbiasvectors(true);
    
    //Add default set of non-linearities
    specLayerParams->add_activations()->mutable_sigmoid();
    specLayerParams->add_activations()->mutable_tanh();
    specLayerParams->add_activations()->mutable_tanh();
    
    //Copy weights
    //Input Weight Matrices
    int blobSize = caffeLayerWeights.blobs(0).data_size();
    int64_t expectedSize = 4*((int64_t)hidden_size)*input_size;
    if (blobSize != expectedSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(expectedSize)+" but found blob of size = "+std::to_string(blobSize)+" in caffe"
                          , caffeLayer.name(), "Recurrent");
    }
    
    ::google::protobuf::RepeatedField<float>* Wi = specLayerParams->mutable_weightparams()->mutable_inputgateweightmatrix()->mutable_floatvalue();
    Wi->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wi->Set(i,caffeLayerWeights.blobs(0).data(i));
    }
    ::google::protobuf::RepeatedField<float>* Wf = specLayerParams->mutable_weightparams()->mutable_forgetgateweightmatrix()->mutable_floatvalue();
    Wf->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wf->Set(i,caffeLayerWeights.blobs(0).data(i + static_cast<int>(hidden_size*input_size)));
    }
    ::google::protobuf::RepeatedField<float>* Wo = specLayerParams->mutable_weightparams()->mutable_outputgateweightmatrix()->mutable_floatvalue();
    Wo->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wo->Set(i,caffeLayerWeights.blobs(0).data(i + 2*static_cast<int>(hidden_size*input_size)));
    }
    ::google::protobuf::RepeatedField<float>* Wz = specLayerParams->mutable_weightparams()->mutable_blockinputweightmatrix()->mutable_floatvalue();
    Wz->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wz->Set(i,caffeLayerWeights.blobs(0).data(i + 3*static_cast<int>(hidden_size*input_size)));
    }
    
    //biases
    blobSize = caffeLayerWeights.blobs(1).data_size();
    expectedSize = 4*((int64_t)hidden_size);
    if (blobSize != expectedSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(expectedSize)+" but found blob of size = "+std::to_string(blobSize)+" in caffe"
                          , caffeLayer.name(), "Recurrent");
    }
    ::google::protobuf::RepeatedField<float>* bi = specLayerParams->mutable_weightparams()->mutable_inputgatebiasvector()->mutable_floatvalue();
    bi->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bi->Set(i,caffeLayerWeights.blobs(1).data(i));
    }
    ::google::protobuf::RepeatedField<float>* bf = specLayerParams->mutable_weightparams()->mutable_forgetgatebiasvector()->mutable_floatvalue();
    bf->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bf->Set(i,caffeLayerWeights.blobs(1).data(i + static_cast<int>(hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* bo = specLayerParams->mutable_weightparams()->mutable_outputgatebiasvector()->mutable_floatvalue();
    bo->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bo->Set(i,caffeLayerWeights.blobs(1).data(i + 2*static_cast<int>(hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* bz = specLayerParams->mutable_weightparams()->mutable_blockinputbiasvector()->mutable_floatvalue();
    bz->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bz->Set(i,caffeLayerWeights.blobs(1).data(i + 3*static_cast<int>(hidden_size)));
    }
    
    
    //Recursion matrices
    blobSize = caffeLayerWeights.blobs(2).data_size();
    expectedSize = 4*((int64_t)hidden_size)*((int64_t)hidden_size);
    if (blobSize != expectedSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(expectedSize)+" but found blob of size = "+std::to_string(blobSize)+" in caffe"
                          , caffeLayer.name(), "Recurrent");
    }
    ::google::protobuf::RepeatedField<float>* Ri = specLayerParams->mutable_weightparams()->mutable_inputgaterecursionmatrix()->mutable_floatvalue();
    Ri->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Ri->Set(i,caffeLayerWeights.blobs(2).data(i));
    }
    ::google::protobuf::RepeatedField<float>* Rf = specLayerParams->mutable_weightparams()->mutable_forgetgaterecursionmatrix()->mutable_floatvalue();
    Rf->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Rf->Set(i,caffeLayerWeights.blobs(2).data(i + static_cast<int>(hidden_size*hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* Ro = specLayerParams->mutable_weightparams()->mutable_outputgaterecursionmatrix()->mutable_floatvalue();
    Ro->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Ro->Set(i,caffeLayerWeights.blobs(2).data(i + 2*static_cast<int>(hidden_size*hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* Rz = specLayerParams->mutable_weightparams()->mutable_blockinputrecursionmatrix()->mutable_floatvalue();
    Rz->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Rz->Set(i,caffeLayerWeights.blobs(2).data(i + 3*static_cast<int>(hidden_size*hidden_size)));
    }
}